

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_regex.hpp
# Opt level: O2

basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 boost::xpressive::
 basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 ::compile(char_type *begin,flag_type flags)

{
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  local_4a0;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> local_230;
  
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>::regex_traits(&local_230);
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  ::regex_compiler(&local_4a0,&local_230);
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  ::compile((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
             *)begin,(char_type *)&local_4a0,flags);
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  ::~regex_compiler(&local_4a0);
  std::locale::~locale(&local_230.super_cpp_regex_traits<char>.loc_);
  return (extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::xpressive::detail::tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0L>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::detail::regex_domain,_0L>
          )(extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::xpressive::detail::tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0L>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::detail::regex_domain,_0L>
            )begin;
}

Assistant:

static basic_regex<BidiIter> compile(char_type const *begin, flag_type flags = regex_constants::ECMAScript)
    {
        return regex_compiler<BidiIter>().compile(begin, flags);
    }